

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

int64_t __thiscall
libtorrent::bdecode_node::list_int_value_at(bdecode_node *this,int i,int64_t default_val)

{
  bdecode_node n;
  bdecode_node local_50;
  
  list_at(&local_50,this,i);
  if (((long)local_50.m_token_idx != -1) &&
     (((ulong)local_50.m_root_tokens[local_50.m_token_idx] & 0xe0000000) == 0x80000000)) {
    default_val = int_value(&local_50);
  }
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&local_50);
  return default_val;
}

Assistant:

std::int64_t bdecode_node::list_int_value_at(int i
		, std::int64_t default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::int_t) return default_val;
		return n.int_value();
	}